

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

void __thiscall Knn::getData(Knn *this,string *filename)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  ostream *poVar1;
  istream *piVar2;
  vector<double,_std::allocator<double>_> temData;
  string line;
  double onepoint;
  ifstream infile;
  byte abStack_3a0 [488];
  stringstream stringin;
  
  temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_Base).inData;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(this_00);
  std::ifstream::ifstream(&infile,(string *)filename,_S_in);
  poVar1 = std::operator<<((ostream *)&std::cout,"reading ...");
  std::endl<char,std::char_traits<char>>(poVar1);
  while ((abStack_3a0[*(long *)(_infile + -0x18)] & 2) == 0) {
    if (temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&infile,(string *)&line);
    if (line._M_string_length != 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stringin,(string *)&line,_S_out|_S_in);
      while( true ) {
        piVar2 = std::istream::_M_extract<double>((double *)&stringin);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        std::vector<double,_std::allocator<double>_>::push_back(&temData,&onepoint);
      }
      (this->super_Base).indim =
           ((long)temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) - 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(this_00,&temData);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stringin);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"total data is ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&line);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temData.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Knn::getData(const std::string &filename) {
    //load data to a vector
    std::vector<double> temData;
    double onepoint;
    std::string line;
    inData.clear();
    std::ifstream infile(filename);
    std::cout<<"reading ..."<<std::endl;
    while(!infile.eof()){
        temData.clear();
        std::getline(infile, line);
        if(line.empty())
            continue;
        std::stringstream stringin(line);
        while(stringin >> onepoint){
            temData.push_back(onepoint);
        }
        indim = temData.size();
        indim -= 1;
        inData.push_back(temData);
    }
    std::cout<<"total data is "<<inData.size()<<std::endl;
}